

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::
DecodeAttributeConnectivitiesOnFace
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *this,
          CornerIndex corner)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  undefined4 in_ESI;
  long in_RDI;
  bool is_seam;
  uint32_t i_1;
  FaceIndex opp_face_id;
  uint32_t i;
  CornerIndex opp_corner;
  int c;
  FaceIndex src_face_id;
  CornerIndex corners [3];
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  MeshEdgebreakerTraversalDecoder *in_stack_ffffffffffffff80;
  CornerTable *in_stack_ffffffffffffff88;
  CornerIndex in_stack_ffffffffffffff90;
  uint local_4c;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_34;
  int local_30;
  undefined4 local_2c;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_28;
  undefined4 local_24;
  undefined4 local_20;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_1c;
  uint local_18;
  uint local_14;
  undefined4 local_4;
  
  local_4 = in_ESI;
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x167da1);
  local_20 = local_4;
  local_18 = (uint)CornerTable::Next(in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x167dca);
  local_24 = local_4;
  local_14 = (uint)CornerTable::Previous(in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x167df3);
  local_2c = local_4;
  local_28.value_ =
       (uint)CornerTable::Face((CornerTable *)
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                               (uint)in_stack_ffffffffffffff80);
  for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x167e2f)
    ;
    local_38 = (&local_1c)[local_30].value_;
    local_34.value_ =
         (uint)CornerTable::Opposite
                         ((CornerTable *)
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          (uint)in_stack_ffffffffffffff80);
    bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                      (&local_34,
                       (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)&kInvalidCornerIndex
                      );
    if (bVar1) {
      for (local_3c = 0; uVar2 = (ulong)local_3c,
          sVar3 = std::
                  vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                  ::size((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                          *)(in_RDI + 0x1f8)), uVar2 < sVar3; local_3c = local_3c + 1) {
        std::
        vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
        ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                      *)(in_RDI + 0x1f8),(ulong)local_3c);
        local_40 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value
                             (&local_1c + local_30);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80,
                   (value_type_conflict1 *)
                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      }
    }
    else {
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x167f00);
      local_44.value_ =
           (uint)CornerTable::Face((CornerTable *)
                                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                   (uint)in_stack_ffffffffffffff80);
      bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<(&local_44,&local_28);
      if (!bVar1) {
        local_4c = 0;
        while( true ) {
          uVar2 = (ulong)local_4c;
          sVar3 = std::
                  vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                  ::size((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                          *)(in_RDI + 0x1f8));
          if (sVar3 <= uVar2) break;
          bVar1 = MeshEdgebreakerTraversalDecoder::DecodeAttributeSeam
                            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          if (bVar1) {
            pvVar4 = std::
                     vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                     ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                                   *)(in_RDI + 0x1f8),(ulong)local_4c);
            in_stack_ffffffffffffff80 =
                 (MeshEdgebreakerTraversalDecoder *)&pvVar4->attribute_seam_corners;
            IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_1c + local_30);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80,
                       (value_type_conflict1 *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          }
          local_4c = local_4c + 1;
        }
      }
    }
  }
  return true;
}

Assistant:

bool MeshEdgebreakerDecoderImpl<
    TraversalDecoder>::DecodeAttributeConnectivitiesOnFace(CornerIndex corner) {
  // Three corners of the face.
  const CornerIndex corners[3] = {corner, corner_table_->Next(corner),
                                  corner_table_->Previous(corner)};

  const FaceIndex src_face_id = corner_table_->Face(corner);
  for (int c = 0; c < 3; ++c) {
    const CornerIndex opp_corner = corner_table_->Opposite(corners[c]);
    if (opp_corner == kInvalidCornerIndex) {
      // Don't decode attribute seams on boundary edges (every boundary edge
      // is automatically an attribute seam).
      for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
        attribute_data_[i].attribute_seam_corners.push_back(corners[c].value());
      }
      continue;
    }
    const FaceIndex opp_face_id = corner_table_->Face(opp_corner);
    // Don't decode edges when the opposite face has been already processed.
    if (opp_face_id < src_face_id) {
      continue;
    }

    for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
      const bool is_seam = traversal_decoder_.DecodeAttributeSeam(i);
      if (is_seam) {
        attribute_data_[i].attribute_seam_corners.push_back(corners[c].value());
      }
    }
  }
  return true;
}